

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::Abort(DeathTestImpl *this,AbortReason reason)

{
  bool bVar1;
  int fd;
  int *piVar2;
  undefined4 in_stack_fffffffffffffeb0;
  undefined1 uVar3;
  undefined1 in_stack_fffffffffffffeb5;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 uVar4;
  int local_13c;
  string local_138 [24];
  undefined8 in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  allocator<char> local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40;
  int local_1c;
  undefined1 local_15;
  int gtest_retval;
  char status_ch;
  DeathTestImpl *pDStack_10;
  AbortReason reason_local;
  DeathTestImpl *this_local;
  
  gtest_retval = reason;
  pDStack_10 = this;
  if (reason == TEST_DID_NOT_DIE) {
    local_15 = 0x4c;
    uVar4 = local_15;
  }
  else {
    in_stack_fffffffffffffeb5 = 0x52;
    in_stack_fffffffffffffeb6 = 0x54;
    uVar4 = in_stack_fffffffffffffeb6;
    local_15 = in_stack_fffffffffffffeb6;
    if (reason != TEST_THREW_EXCEPTION) {
      in_stack_fffffffffffffeb6 = 0x52;
      uVar4 = in_stack_fffffffffffffeb6;
      local_15 = in_stack_fffffffffffffeb6;
    }
  }
  do {
    do {
      fd = write_fd(this);
      local_1c = posix::Write(fd,&local_15,1);
      uVar3 = false;
      if (local_1c == -1) {
        piVar2 = __errno_location();
        uVar3 = *piVar2 == 4;
      }
    } while ((bool)uVar3 != false);
    if (local_1c == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_100,"CHECK failed: File ",&local_101)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffeb6,
                                                     CONCAT15(in_stack_fffffffffffffeb5,
                                                              CONCAT14(uVar3,
                                                  in_stack_fffffffffffffeb0)))));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffeb6,
                                                     CONCAT15(in_stack_fffffffffffffeb5,
                                                              CONCAT14(uVar3,
                                                  in_stack_fffffffffffffeb0)))));
      local_13c = 0x1f9;
      StreamableToString<int>((string *)local_138,&local_13c);
      std::operator+(in_stack_fffffffffffffee8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffee0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffeb6,
                                                     CONCAT15(in_stack_fffffffffffffeb5,
                                                              CONCAT14(uVar3,
                                                  in_stack_fffffffffffffeb0)))));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffeb6,
                                                     CONCAT15(in_stack_fffffffffffffeb5,
                                                              CONCAT14(uVar3,
                                                  in_stack_fffffffffffffeb0)))));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                     (char *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffeb6,
                                                     CONCAT15(in_stack_fffffffffffffeb5,
                                                              CONCAT14(uVar3,
                                                  in_stack_fffffffffffffeb0)))));
      DeathTestAbort(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_138);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string(local_e0);
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator(&local_101);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  _exit(1);
}

Assistant:

void DeathTestImpl::Abort(AbortReason reason) {
  // The parent process considers the death test to be a failure if
  // it finds any data in our pipe.  So, here we write a single flag byte
  // to the pipe, then exit.
  const char status_ch =
      reason == TEST_DID_NOT_DIE ? kDeathTestLived :
      reason == TEST_THREW_EXCEPTION ? kDeathTestThrew : kDeathTestReturned;

  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Write(write_fd(), &status_ch, 1));
  // We are leaking the descriptor here because on some platforms (i.e.,
  // when built as Windows DLL), destructors of global objects will still
  // run after calling _exit(). On such systems, write_fd_ will be
  // indirectly closed from the destructor of UnitTestImpl, causing double
  // close if it is also closed here. On debug configurations, double close
  // may assert. As there are no in-process buffers to flush here, we are
  // relying on the OS to close the descriptor after the process terminates
  // when the destructors are not run.
  _exit(1);  // Exits w/o any normal exit hooks (we were supposed to crash)
}